

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  cpp_dec_float<50U,_int,_void> *this_00;
  cpp_dec_float<50U,_int,_void> *pcVar1;
  cpp_dec_float<50U,_int,_void> *this_01;
  bool bVar2;
  int32_t iVar3;
  pointer pnVar4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  fpclass_type fVar10;
  ulong uVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar13;
  Real a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_fc;
  cpp_dec_float<50U,_int,_void> local_d8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  
  uVar9 = (int)((long)(x->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(x->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  local_a0 = A;
  if (uVar9 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    if ((int)uVar9 < 1) {
      local_fc = 0;
    }
    else {
      uVar13 = 0;
      this_01 = &local_d8;
      local_fc = 0;
      do {
        pnVar4 = (x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = &pnVar4[uVar13].m_backend;
        fVar10 = cpp_dec_float_NaN;
        if (pnVar4[uVar13].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00293cc2:
          local_38 = *(uint (*) [2])((this_00->data)._M_elems + 8);
          local_58 = *(uint (*) [2])(this_00->data)._M_elems;
          auStack_50 = *(uint (*) [2])((this_00->data)._M_elems + 2);
          local_48 = *(uint (*) [2])((this_00->data)._M_elems + 4);
          auStack_40 = *(uint (*) [2])((this_00->data)._M_elems + 6);
          iVar8 = this_00->exp;
          bVar2 = this_00->neg;
          iVar3 = this_00->prec_elem;
          a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          local_98.data._M_elems[8] = local_38[0];
          local_98.data._M_elems[9] = local_38[1];
          local_98.data._M_elems[4] = local_48[0];
          local_98.data._M_elems[5] = local_48[1];
          local_98.data._M_elems[6] = auStack_40[0];
          local_98.data._M_elems[7] = auStack_40[1];
          local_98.data._M_elems[0] = local_58[0];
          local_98.data._M_elems[1] = local_58[1];
          uVar7 = local_98.data._M_elems._0_8_;
          local_98.data._M_elems[2] = auStack_50[0];
          local_98.data._M_elems[3] = auStack_50[1];
          local_98.neg = bVar2;
          if ((bVar2 == true) &&
             (local_98.data._M_elems[0] = local_58[0],
             local_98.data._M_elems[0] != 0 || fVar10 != cpp_dec_float_finite)) {
            local_98.neg = false;
          }
          local_98.data._M_elems._0_8_ = uVar7;
          local_98.exp = iVar8;
          local_98.fpclass = fVar10;
          local_98.prec_elem = iVar3;
          if ((fVar10 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems._24_5_ = 0;
            local_d8.data._M_elems[7]._1_3_ = 0;
            local_d8.data._M_elems._32_5_ = 0;
            local_d8.data._M_elems[9]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)this_01,a);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_98,this_01);
            if (0 < iVar8) {
              pIVar5 = (local_a0->set).theitem;
              iVar8 = (local_a0->set).thekey[uVar13].idx;
              lVar12 = (long)local_fc;
              local_fc = local_fc + 1;
              (x->super_IdxSet).idx[lVar12] = (int)uVar13;
              lVar12 = (long)pIVar5[iVar8].data.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
              if (0 < lVar12) {
                uVar11 = lVar12 + 1;
                lVar12 = lVar12 * 0x3c;
                do {
                  pNVar6 = pIVar5[iVar8].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem;
                  pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                           ((long)&pNVar6[-1].val.m_backend.data + lVar12);
                  local_d8.fpclass = cpp_dec_float_finite;
                  local_d8.prec_elem = 10;
                  local_d8.data._M_elems._32_5_ = 0;
                  local_d8.data._M_elems[9]._1_3_ = 0;
                  local_d8.exp = 0;
                  local_d8.neg = false;
                  local_d8.data._M_elems[4] = 0;
                  local_d8.data._M_elems[5] = 0;
                  local_d8.data._M_elems._24_5_ = 0;
                  local_d8.data._M_elems[7]._1_3_ = 0;
                  local_d8.data._M_elems[0] = 0;
                  local_d8.data._M_elems[1] = 0;
                  local_d8.data._M_elems[2] = 0;
                  local_d8.data._M_elems[3] = 0;
                  v = pcVar1;
                  if (pcVar1 == this_01) {
                    v = this_00;
                  }
                  if (pcVar1 != this_01 && this_01 != this_00) {
                    uVar7 = *(undefined8 *)((this_00->data)._M_elems + 8);
                    local_d8.data._M_elems._32_5_ = SUB85(uVar7,0);
                    local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
                    local_d8.data._M_elems._0_8_ = *(undefined8 *)(this_00->data)._M_elems;
                    local_d8.data._M_elems._8_8_ = *(undefined8 *)((this_00->data)._M_elems + 2);
                    local_d8.data._M_elems._16_8_ = *(undefined8 *)((this_00->data)._M_elems + 4);
                    uVar7 = *(undefined8 *)((this_00->data)._M_elems + 6);
                    local_d8.data._M_elems._24_5_ = SUB85(uVar7,0);
                    local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
                    local_d8.exp = this_00->exp;
                    local_d8.neg = this_00->neg;
                    local_d8.fpclass = this_00->fpclass;
                    local_d8.prec_elem = this_00->prec_elem;
                    v = pcVar1;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            (this_01,v);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)*(int *)((long)(&pNVar6[-1].val + 1) + lVar12) * 0x38 +
                             *(long *)(this + 0x20)),this_01);
                  uVar11 = uVar11 - 1;
                  lVar12 = lVar12 + -0x3c;
                } while (1 < uVar11);
              }
              goto LAB_00293ede;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (this_01,0,(type *)0x0);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (this_00,this_01);
          if (iVar8 != 0) {
            fVar10 = this_00->fpclass;
            goto LAB_00293cc2;
          }
        }
LAB_00293ede:
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uVar9 & 0x7fffffff));
    }
    (x->super_IdxSet).num = local_fc;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}